

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::columnMoved(QTableView *this,int column,int oldIndex,int newIndex)

{
  long lVar1;
  QWidgetData *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 in_register_00000034;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x268))(this,CONCAT44(in_register_00000034,column));
  iVar3 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x580),oldIndex);
  iVar4 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x580),newIndex);
  if (*(long *)(lVar1 + 0x650) != lVar1 + 0x650) {
    QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
    return;
  }
  iVar5 = columnViewportPosition(this,iVar3);
  iVar6 = columnViewportPosition(this,iVar4);
  iVar7 = columnWidth(this,iVar3);
  iVar4 = columnWidth(this,iVar4);
  iVar3 = iVar6;
  if (iVar5 < iVar6) {
    iVar3 = iVar5;
  }
  iVar8 = iVar4 + iVar6;
  if (iVar4 + iVar6 < iVar7 + iVar5) {
    iVar8 = iVar7 + iVar5;
  }
  pQVar2 = (*(QWidget **)(lVar1 + 0x2b0))->data;
  QWidget::update(*(QWidget **)(lVar1 + 0x2b0),iVar3,0,iVar8 - iVar3,
                  ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1);
  return;
}

Assistant:

void QTableView::columnMoved(int column, int oldIndex, int newIndex)
{
    Q_UNUSED(column);
    Q_D(QTableView);

    updateGeometries();
    int logicalOldIndex = d->horizontalHeader->logicalIndex(oldIndex);
    int logicalNewIndex = d->horizontalHeader->logicalIndex(newIndex);
    if (d->hasSpans()) {
        d->viewport->update();
    } else {
        int oldLeft = columnViewportPosition(logicalOldIndex);
        int newLeft = columnViewportPosition(logicalNewIndex);
        int oldRight = oldLeft + columnWidth(logicalOldIndex);
        int newRight = newLeft + columnWidth(logicalNewIndex);
        int left = qMin(oldLeft, newLeft);
        int right = qMax(oldRight, newRight);
        int width = right - left;
        d->viewport->update(left, 0, width, d->viewport->height());
    }
}